

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void __thiscall gguf_writer::write<unsigned_int>(gguf_writer *this,uint *val)

{
  vector<signed_char,_std::allocator<signed_char>_> *in_RSI;
  size_t i;
  value_type_conflict3 *__x;
  
  for (__x = (value_type_conflict3 *)0x0; __x < (value_type_conflict3 *)0x4; __x = __x + 1) {
    std::vector<signed_char,_std::allocator<signed_char>_>::push_back(in_RSI,__x);
  }
  return;
}

Assistant:

void write(const T & val) const {
        for (size_t i = 0; i < sizeof(val); ++i) {
            buf.push_back(reinterpret_cast<const int8_t *>(&val)[i]);
        }
    }